

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PodVectorTests.cpp
# Opt level: O3

void __thiscall agge::tests::PODVectorTests::PODVectorTests(PODVectorTests *this)

{
  registry *prVar1;
  
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)NewVectorHasExpectedState,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)AppendingIncreasesSize,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)AppendingIncreasesSizeFromInitial,(char *)0x0)
  ;
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)StateIsResetOnClear,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)BufferIsPreservedOnClear,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)AppendedValuesAreCopied,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)VectorIsIndexed,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)IndexedReferencesAreThoseActuallyStored,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)InitialCapacityEqualsToInitialSize,(char *)0x0
            );
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)
                    AppendingOverCapacityIncresesCapacityByHalfOfCurrent,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)
                    IncresingCapacityPreservesOldValuesAndPushesNew,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)CopyingVectorCopiesElements,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)ResizedVectorGuranteesItsRangeSize,(char *)0x0
            );
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)ResizingToASmallerSizeDoesNotDecreaseCapacity,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)ResizingToALargerSizeIncreaseCapacity,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)ResizePreservesContent,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)
                    AssigningAValueResizesVectorToAppropriateSizeAndFillsIt,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)PoppingLastElementReducesSize,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)AppendingReturnsIteratorToTheElementAppended,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)SwappingVectorsOnlySwapsTheirBaseIterators,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::PODVectorTests>
            (prVar1,(offset_in_PODVectorTests_to_subr)NewEndIsReturnedAfterSetting,(char *)0x0);
  return;
}

Assistant:

test( NewVectorHasExpectedState )
			{
				// INIT / ACT
				pod_vector<char> empty1;
				pod_vector<double> empty2(0);
				pod_vector<A> As(10);
				const pod_vector<B> Bs(13211);

				// ACT / ASSERT
				assert_is_true(empty1.empty());
				assert_equal(0u, empty1.size());
				assert_equal(0u, empty1.capacity());
				assert_equal(empty1.end(), empty1.begin());
				assert_is_true(empty2.empty());
				assert_equal(0u, empty2.size());
				assert_equal(0u, empty2.capacity());
				assert_equal(empty2.end(), empty2.begin());

				assert_is_false(As.empty());
				assert_equal(10u, As.size());
				assert_is_true(10u <= As.capacity());
				assert_equal(10, As.end() - As.begin());
				assert_is_false(Bs.empty());
				assert_equal(13211u, Bs.size());
				assert_is_true(13211u <= Bs.capacity());
				assert_equal(13211, Bs.end() - Bs.begin());
			}